

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_io.c
# Opt level: O1

int kvtree_close(char *file,int fd)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  char *pcVar4;
  
  iVar2 = fsync(fd);
  if (iVar2 < 0) {
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    pcVar4 = strerror(uVar1);
    kvtree_dbg(2,"Failed to fsync file descriptor: %s errno=%d %s @ %s:%d",file,(ulong)uVar1,pcVar4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
               ,0x7a);
  }
  iVar2 = close(fd);
  if (iVar2 != 0) {
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    pcVar4 = strerror(uVar1);
    kvtree_err("Closing file descriptor %d for file %s: errno=%d %s @ %s:%d",fd,file,(ulong)uVar1,
               pcVar4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
               ,0x82);
  }
  return (uint)(iVar2 != 0);
}

Assistant:

int kvtree_close(const char* file, int fd)
{
  /* fsync first */
  if (fsync(fd) < 0) {
    /* print warning that fsync failed */
    kvtree_dbg(2, "Failed to fsync file descriptor: %s errno=%d %s @ %s:%d",
      file, errno, strerror(errno), __FILE__, __LINE__
    );
  }

  /* now close the file */
  if (close(fd) != 0) {
    /* hit an error, print message */
    kvtree_err("Closing file descriptor %d for file %s: errno=%d %s @ %s:%d",
      fd, file, errno, strerror(errno), __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  return KVTREE_SUCCESS;
}